

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

uint prvTidynodeHeaderLevel(Node *node)

{
  TidyTagId TVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((node != (Node *)0x0) && (uVar2 = 0, node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
    uVar2 = 0;
    if (TVar1 - TidyTag_H1 < 6) {
      uVar2 = TVar1 - TidyTag_FRAMESET;
    }
  }
  return uVar2;
}

Assistant:

uint TY_(nodeHeaderLevel)( Node* node )
{
    TidyTagId tid = TagId( node  );
    switch ( tid )
    {
    case TidyTag_H1:
        return 1;
    case TidyTag_H2:
        return 2;
    case TidyTag_H3:
        return 3;
    case TidyTag_H4:
        return 4;
    case TidyTag_H5:
        return 5;
    case TidyTag_H6:
        return 6;
    default:
    {
        /* fall through */
    }
    }
    return 0;
}